

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmltosmf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  basic_command_line_parser<char> *this;
  size_type sVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fileImage;
  size_t lineNumber;
  path path;
  string mml;
  string output;
  string input;
  fstream fs;
  char local_418 [16];
  byte abStack_408 [200];
  undefined8 auStack_340 [38];
  positional_options_description pd;
  Smf smf;
  options_description desc;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [144];
  
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&fs,"options",(allocator<char> *)&vm)
  ;
  boost::program_options::options_description::options_description
            (&desc,(string *)&fs,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&fs);
  _fs = (pointer)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&fs,"version");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"help");
  ptVar2 = boost::program_options::value<std::__cxx11::string>(&input);
  ptVar2->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input,i",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>(&output);
  ptVar2->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"output,o",(char *)ptVar2);
  boost::program_options::positional_options_description::positional_options_description(&pd);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&fs,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&fs,&desc);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&path,this);
  boost::program_options::store((basic_parsed_options *)&path,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&path);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&fs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs,"version",(allocator<char> *)&path);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_c0,(key_type *)&fs);
  std::__cxx11::string::~string((string *)&fs);
  if (sVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fs,"help",(allocator<char> *)&path);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_c0,(key_type *)&fs);
    std::__cxx11::string::~string((string *)&fs);
    if (sVar3 == 0) {
      boost::program_options::notify(&vm);
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (&path,(__cxx11 *)&input,__source);
      std::fstream::fstream(&fs,path._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
      if ((abStack_408[*(long *)(_fs + -0x18)] & 5) != 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"input file open error.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      mml._M_dataplus._M_p = (pointer)&mml.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&mml,*(undefined8 *)((long)auStack_340 + *(long *)(_fs + -0x18)),
                 0xffffffffffffffff,0,0xffffffff);
      std::fstream::~fstream(&fs);
      std::filesystem::__cxx11::path::~path(&path);
      rlib::sequencer::mmlToSmf(&smf,&mml);
      rlib::midi::Smf::getFileImage(&fileImage,&smf);
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (&path,(__cxx11 *)&output,__source_00);
      std::fstream::fstream(&fs,path._M_pathname._M_dataplus._M_p,_S_trunc|_S_out|_S_bin);
      if ((abStack_408[*(long *)(_fs + -0x18)] & 5) != 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"output file open error.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::ostream::write(local_418,
                          (long)fileImage.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::fstream::~fstream(&fs);
      std::filesystem::__cxx11::path::~path(&path);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&fileImage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::_List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
      _M_clear(&smf.tracks.
                super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>);
      std::__cxx11::string::~string((string *)&mml);
      goto LAB_0010dfd7;
    }
    poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"mmltosmf version 1.2.3");
  }
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010dfd7:
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::positional_options_description::~positional_options_description(&pd);
  boost::program_options::options_description::~options_description(&desc);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&input);
  return 0;
}

Assistant:

int main(const int argc, const char* const argv[])
{
	namespace po = boost::program_options;

	try {
		std::string input, output;
		po::options_description desc("options");
		desc.add_options()
			("version", "show version")
			("help", "show help")
			("input,i", po::value(&input)->required(), "input file (required)")		// 入力ファイルパス(mml)
			("output,o", po::value(&output)->required(), "output file (required)")	// 出力ファイル(mid)
			;

		po::positional_options_description pd;
		// pd.add("input", -1);

		po::variables_map vm;
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pd).run(), vm);

		if (vm.count("version")) {
			std::cout << "mmltosmf version 1.2.3" << std::endl;
			return 0;
		}

		if (vm.count("help")) {
			std::cout << desc << std::endl;		// ヘルプ表示
			return 0;
		}

		po::notify(vm);

		const std::string mml = [&] {
			auto path = std::filesystem::u8path(input);
			std::fstream fs(path, std::ios::in | std::ios::binary);
			if (fs.fail()) {
				throw std::runtime_error("input file open error.");
			}
			const std::istreambuf_iterator<char> begin(fs);
			return std::string(begin, std::istreambuf_iterator<char>());
		}();

		try {
			const midi::Smf smf = sequencer::mmlToSmf(mml);
			auto fileImage = smf.getFileImage();

			auto path = std::filesystem::u8path(output);
			std::fstream fs(path, std::ios::out | std::ios::binary | std::ios::trunc);
			if (fs.fail()) {
				throw std::runtime_error("output file open error.");
			}
			fs.write(reinterpret_cast<const char* const>(fileImage.data()), fileImage.size());

		} catch (const sequencer::MmlCompiler::Exception& e) {

			const size_t lineNumber = [&] {	// 行番号取得
				static const std::regex re(R"(\r\n|\n|\r)");
				size_t lf = 0;
				for (auto i = std::sregex_token_iterator(mml.cbegin(), e.it, re, -1); i != std::sregex_token_iterator(); i++) lf++;
				return lf;
			}();
			const auto msg = sequencer::MmlCompiler::Exception::getMessage(e.code);	// エラーメッセージ取得
			auto errorWord = [&] {
				std::string s(e.errorWord);
				std::smatch m;
				if (std::regex_search(s, m, std::regex(R"(\r\n|\n|\r)"))) {
					s = std::string(s.cbegin(), m[0].first);
				}
				return s;
			}();

			const auto s = string::format(R"(line %d %s : %s)", lineNumber, errorWord, msg);
			throw std::runtime_error(s);
		}

	} catch (std::exception& e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}

	return 0;
}